

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O3

Num3072 * __thiscall Num3072::GetInverse(Num3072 *__return_storage_ptr__,Num3072 *this)

{
  Num3072 *this_00;
  long lVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  code *pcStack_1240;
  Num3072 p [12];
  
  p[1].limbs[0x11] = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = 8;
  do {
    *(undefined8 *)((long)p[0].limbs + lVar6 + -8) = 1;
    pcStack_1240 = (code *)0x768ba1;
    memset((void *)((long)p[0].limbs + lVar6),0,0x178);
    lVar6 = lVar6 + 0x180;
  } while (lVar6 != 0x1208);
  pcStack_1240 = (code *)0x768bc1;
  memcpy(p,this,0x180);
  lVar6 = 0;
  do {
    lVar5 = lVar6 + 1;
    this_00 = p + lVar6 + 1;
    pcStack_1240 = (code *)0x768bf5;
    memcpy(this_00,p + lVar6,0x180);
    uVar3 = 1;
    do {
      pcStack_1240 = (code *)0x768c02;
      Square(this_00);
      uVar2 = uVar3 >> ((byte)lVar6 & 0x1f);
      uVar3 = uVar3 + 1;
    } while (uVar2 == 0);
    pcStack_1240 = (code *)0x768c1a;
    Multiply(this_00,p + lVar6);
    lVar6 = lVar5;
  } while (lVar5 != 0xb);
  pcStack_1240 = (code *)0x768c35;
  memcpy(__return_storage_ptr__,p + 0xb,0x180);
  iVar4 = 0x200;
  do {
    pcStack_1240 = (code *)0x768c42;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pcStack_1240 = (code *)0x768c56;
  Multiply(__return_storage_ptr__,p + 9);
  iVar4 = 0x100;
  do {
    pcStack_1240 = (code *)0x768c63;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pcStack_1240 = (code *)0x768c77;
  Multiply(__return_storage_ptr__,p + 8);
  iVar4 = 0x80;
  do {
    pcStack_1240 = (code *)0x768c84;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pcStack_1240 = (code *)0x768c98;
  Multiply(__return_storage_ptr__,p + 7);
  iVar4 = 0x40;
  do {
    pcStack_1240 = (code *)0x768ca5;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pcStack_1240 = (code *)0x768cb9;
  Multiply(__return_storage_ptr__,p + 6);
  iVar4 = 0x20;
  do {
    pcStack_1240 = (code *)0x768cc6;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pcStack_1240 = (code *)0x768cda;
  Multiply(__return_storage_ptr__,p + 5);
  iVar4 = 8;
  do {
    pcStack_1240 = (code *)0x768ce7;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pcStack_1240 = (code *)0x768cfb;
  Multiply(__return_storage_ptr__,p + 3);
  iVar4 = 2;
  do {
    pcStack_1240 = (code *)0x768d08;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pcStack_1240 = (code *)0x768d1f;
  Multiply(__return_storage_ptr__,p + 1);
  pcStack_1240 = (code *)0x768d27;
  Square(__return_storage_ptr__);
  pcStack_1240 = (code *)0x768d32;
  Multiply(__return_storage_ptr__,p);
  iVar4 = 5;
  do {
    pcStack_1240 = (code *)0x768d3f;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pcStack_1240 = (code *)0x768d53;
  Multiply(__return_storage_ptr__,p + 2);
  iVar4 = 3;
  do {
    pcStack_1240 = (code *)0x768d60;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pcStack_1240 = (code *)0x768d6f;
  Multiply(__return_storage_ptr__,p);
  iVar4 = 2;
  do {
    pcStack_1240 = (code *)0x768d7c;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pcStack_1240 = (code *)0x768d8b;
  Multiply(__return_storage_ptr__,p);
  iVar4 = 4;
  do {
    pcStack_1240 = (code *)0x768d98;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pcStack_1240 = (code *)0x768da7;
  Multiply(__return_storage_ptr__,p);
  iVar4 = 4;
  do {
    pcStack_1240 = (code *)0x768db4;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pcStack_1240 = (code *)0x768dc3;
  Multiply(__return_storage_ptr__,p + 1);
  iVar4 = 3;
  do {
    pcStack_1240 = (code *)0x768dd0;
    Square(__return_storage_ptr__);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  pcStack_1240 = (code *)0x768ddf;
  Multiply(__return_storage_ptr__,p);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  pcStack_1240 = Square;
  __stack_chk_fail();
}

Assistant:

Num3072 Num3072::GetInverse() const
{
    // For fast exponentiation a sliding window exponentiation with repunit
    // precomputation is utilized. See "Fast Point Decompression for Standard
    // Elliptic Curves" (Brumley, Järvinen, 2008).

    Num3072 p[12]; // p[i] = a^(2^(2^i)-1)
    Num3072 out;

    p[0] = *this;

    for (int i = 0; i < 11; ++i) {
        p[i + 1] = p[i];
        for (int j = 0; j < (1 << i); ++j) p[i + 1].Square();
        p[i + 1].Multiply(p[i]);
    }

    out = p[11];

    square_n_mul(out, 512, p[9]);
    square_n_mul(out, 256, p[8]);
    square_n_mul(out, 128, p[7]);
    square_n_mul(out, 64, p[6]);
    square_n_mul(out, 32, p[5]);
    square_n_mul(out, 8, p[3]);
    square_n_mul(out, 2, p[1]);
    square_n_mul(out, 1, p[0]);
    square_n_mul(out, 5, p[2]);
    square_n_mul(out, 3, p[0]);
    square_n_mul(out, 2, p[0]);
    square_n_mul(out, 4, p[0]);
    square_n_mul(out, 4, p[1]);
    square_n_mul(out, 3, p[0]);

    return out;
}